

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

void __thiscall DIntermissionScreenText::Drawer(DIntermissionScreenText *this)

{
  int iVar1;
  bool bVar2;
  undefined4 extraout_var;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int w;
  int local_4c;
  char *local_48;
  int local_3c;
  FRemapTable *local_38;
  
  DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
  iVar6 = (this->super_DIntermissionScreen).mTicker;
  if (this->mTextDelay <= iVar6) {
    local_48 = this->mText;
    cVar7 = *local_48;
    if (cVar7 == '\0') {
      iVar3 = 1;
    }
    else {
      iVar3 = 1;
      pcVar4 = local_48;
      do {
        pcVar4 = pcVar4 + 1;
        iVar3 = iVar3 + (uint)(cVar7 == '\n');
        cVar7 = *pcVar4;
      } while (cVar7 != '\0');
    }
    uVar5 = -(uint)(((undefined1)gameinfo.gametype & GAME_DoomStrifeChex) == GAME_Any) | 3;
    iVar8 = uVar5 * CleanYfac;
    iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    iVar11 = (this->mTextY + -100) * CleanYfac + iVar1 / 2;
    iVar9 = -iVar8;
    if (0 < iVar8) {
      iVar10 = CleanYfac *
               (((this->mTextY + (SmallFont->FontHeight + uVar5) * iVar3) - uVar5) + -100) +
               iVar1 / 2 + iVar3 + -1;
      do {
        iVar10 = iVar10 + (1 - iVar3);
        if (iVar10 <= iVar1) goto LAB_00300f6f;
        iVar9 = iVar9 + 1;
        bVar2 = 1 < iVar8;
        iVar8 = iVar8 + -1;
      } while (bVar2);
      iVar8 = 0;
      iVar9 = 0;
    }
LAB_00300f6f:
    local_3c = CleanYfac * SmallFont->FontHeight + iVar8;
    if (iVar1 < iVar9 + iVar11 + iVar3 * local_3c) {
      iVar3 = (iVar8 + iVar1) - iVar3 * local_3c;
      iVar11 = 0;
      if (0 < iVar3 / 2) {
        iVar11 = iVar3 / 2;
      }
    }
    iVar8 = (this->mTextX + -0xa0) * CleanXfac;
    iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar1 = SmallFont->GlobalKerning;
    iVar6 = (iVar6 - this->mTextDelay) / this->mTextSpeed;
    local_38 = FFont::GetColorTranslation(SmallFont,this->mTextColor);
    if (iVar6 != 0) {
      iVar8 = iVar3 / 2 + iVar8;
      lVar12 = 0;
      pcVar4 = local_48;
      iVar3 = iVar8;
      do {
        cVar7 = pcVar4[lVar12];
        if (cVar7 == '\n') {
          iVar11 = iVar11 + local_3c;
          iVar3 = iVar8;
        }
        else {
          if (cVar7 == '\0') {
            return;
          }
          iVar9 = (*SmallFont->_vptr_FFont[2])(SmallFont,(ulong)(uint)(int)cVar7,&local_4c);
          local_4c = (local_4c + iVar1) * CleanXfac;
          pcVar4 = local_48;
          if (local_4c + iVar3 <= (screen->super_DSimpleCanvas).super_DCanvas.Width) {
            if ((FTexture *)CONCAT44(extraout_var,iVar9) != (FTexture *)0x0) {
              DCanvas::DrawTexture
                        ((DCanvas *)screen,(FTexture *)CONCAT44(extraout_var,iVar9),(double)iVar3,
                         (double)iVar11,0x4000138e,local_38,0x40001393,1,0);
            }
            iVar3 = iVar3 + local_4c;
            pcVar4 = local_48;
          }
        }
        lVar12 = lVar12 + 1;
      } while (iVar6 != lVar12);
    }
  }
  return;
}

Assistant:

void DIntermissionScreenText::Drawer ()
{
	Super::Drawer();
	if (mTicker >= mTextDelay)
	{
		FTexture *pic;
		int w;
		size_t count;
		int c;
		const FRemapTable *range;
		const char *ch = mText;
		const int kerning = SmallFont->GetDefaultKerning();

		// Count number of rows in this text. Since it does not word-wrap, we just count
		// line feed characters.
		int numrows;

		for (numrows = 1, c = 0; ch[c] != '\0'; ++c)
		{
			numrows += (ch[c] == '\n');
		}

		int rowheight = SmallFont->GetHeight() * CleanYfac;
		int rowpadding = (gameinfo.gametype & (GAME_DoomStrifeChex) ? 3 : -1) * CleanYfac;

		int cx = (mTextX - 160)*CleanXfac + screen->GetWidth() / 2;
		int cy = (mTextY - 100)*CleanYfac + screen->GetHeight() / 2;
		int startx = cx;

		// Does this text fall off the end of the screen? If so, try to eliminate some margins first.
		while (rowpadding > 0 && cy + numrows * (rowheight + rowpadding) - rowpadding > screen->GetHeight())
		{
			rowpadding--;
		}
		// If it's still off the bottom, try to center it vertically.
		if (cy + numrows * (rowheight + rowpadding) - rowpadding > screen->GetHeight())
		{
			cy = (screen->GetHeight() - (numrows * (rowheight + rowpadding) - rowpadding)) / 2;
			// If it's off the top now, you're screwed. It's too tall to fit.
			if (cy < 0)
			{
				cy = 0;
			}
		}
		rowheight += rowpadding;

		// draw some of the text onto the screen
		count = (mTicker - mTextDelay) / mTextSpeed;
		range = SmallFont->GetColorTranslation (mTextColor);

		for ( ; count > 0 ; count-- )
		{
			c = *ch++;
			if (!c)
				break;
			if (c == '\n')
			{
				cx = startx;
				cy += rowheight;
				continue;
			}

			pic = SmallFont->GetChar (c, &w);
			w += kerning;
			w *= CleanXfac;
			if (cx + w > SCREENWIDTH)
				continue;
			if (pic != NULL)
			{
				screen->DrawTexture (pic,
					cx,
					cy,
					DTA_Translation, range,
					DTA_CleanNoMove, true,
					TAG_DONE);
			}
			cx += w;
		}
	}
}